

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O0

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
__thiscall
Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>::
operator()(EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize> *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *poly,PolyNf *evaluatedArgs)

{
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *extraout_RDX;
  undefined8 in_RDI;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  PVar1;
  uint offs;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffed0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this_00;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:238:23),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *in_stack_ffffffffffffff48;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff68;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff70;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *in_stack_ffffffffffffff80;
  anon_class_24_3_a16dcd4f_for__func in_stack_ffffffffffffff90;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_20;
  
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>::
  operator->(in_RDX);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands
            (in_stack_fffffffffffffed0);
  this_00 = &local_20;
  t = (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&stack0xffffffffffffff60;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
  ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff90);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:238:23),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(in_stack_ffffffffffffff48);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_ffffffffffffff70,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
             in_stack_ffffffffffffff68);
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>(t);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x75f5eb);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(this_00);
  PVar1._ptr = extraout_RDX;
  PVar1._0_8_ = in_RDI;
  return PVar1;
}

Assistant:

Perfect<Polynom<NumTraits>> operator()(Perfect<Polynom<NumTraits>> poly, PolyNf* evaluatedArgs)
  { 
    using Polynom   = Kernel::Polynom<NumTraits>;
    using Monom  = Kernel::Monom<NumTraits>;

    unsigned offs = 0;
    return perfect(Polynom(
                poly->iterSummands()
                 .map([&](Monom m) -> Monom { 
                   auto result = eval(m, &evaluatedArgs[offs]);
                   offs += m.factors->nFactors();
                   return result;
               })
            .template collect<Stack>()));
  }